

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O1

int Mop_ManMergeDist1Pairs
              (Mop_Man_t *p,Vec_Int_t *vGroup,Vec_Int_t *vGroupPrev,Vec_Int_t *vStats,int nLimit)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  word *pwVar7;
  Vec_Int_t *pVVar8;
  word *pwVar9;
  bool bVar10;
  byte bVar11;
  bool bVar12;
  uint uVar13;
  int iVar14;
  Vec_Int_t *vPairs;
  Vec_Int_t *__ptr;
  Vec_Int_t *p_00;
  int *piVar15;
  byte bVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  bool bVar27;
  
  vPairs = Mop_ManFindDist1Pairs(p,vGroup);
  __ptr = Mop_ManCompatiblePairs(vPairs,vGroup->nSize);
  iVar1 = vGroup->nSize;
  iVar2 = vGroupPrev->nSize;
  iVar3 = __ptr->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar14 = iVar3;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar14;
  if (iVar14 == 0) {
    piVar15 = (int *)0x0;
  }
  else {
    piVar15 = (int *)malloc((long)iVar14 << 2);
  }
  p_00->pArray = piVar15;
  if (iVar3 < 2) {
LAB_00335f67:
    iVar14 = p_00->nSize;
    if (0 < (long)iVar14) {
      piVar15 = p_00->pArray;
      lVar26 = 0;
      do {
        iVar4 = piVar15[lVar26];
        lVar20 = (long)iVar4;
        if ((lVar20 < 0) || (vGroup->nSize <= iVar4)) {
LAB_003360e8:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (vGroup->pArray[lVar20] != -1) {
          Vec_IntPush(p->vFree,vGroup->pArray[lVar20]);
          if (vGroup->nSize <= iVar4) goto LAB_00336145;
          vGroup->pArray[lVar20] = -1;
        }
        lVar26 = lVar26 + 1;
      } while (iVar14 != lVar26);
    }
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
      p_00->pArray = (int *)0x0;
    }
    free(p_00);
    if (0 < iVar3) {
      uVar13 = vGroup->nSize;
      uVar19 = (ulong)uVar13;
      if ((int)uVar13 < 1) {
        uVar17 = 0;
      }
      else {
        piVar15 = vGroup->pArray;
        lVar26 = 0;
        uVar17 = 0;
        do {
          iVar3 = piVar15[lVar26];
          if (iVar3 != -1) {
            if (((int)uVar17 < 0) || ((int)uVar19 <= (int)uVar17)) {
LAB_00336145:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            uVar19 = (ulong)uVar17;
            uVar17 = uVar17 + 1;
            piVar15[uVar19] = iVar3;
          }
          lVar26 = lVar26 + 1;
          uVar13 = vGroup->nSize;
          uVar19 = (ulong)(int)uVar13;
        } while (lVar26 < (long)uVar19);
      }
      if ((int)uVar13 < (int)uVar17) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      vGroup->nSize = uVar17;
    }
    if (vPairs->pArray != (int *)0x0) {
      free(vPairs->pArray);
      vPairs->pArray = (int *)0x0;
    }
    if (vPairs != (Vec_Int_t *)0x0) {
      free(vPairs);
    }
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (int *)0x0;
    }
    if (__ptr != (Vec_Int_t *)0x0) {
      free(__ptr);
    }
    return (iVar2 + iVar1) - (vGroup->nSize + vGroupPrev->nSize);
  }
  piVar15 = __ptr->pArray;
  lVar26 = 0;
LAB_00335c10:
  iVar14 = piVar15[lVar26];
  lVar20 = (long)iVar14;
  if ((lVar20 < 0) || (vGroup->nSize <= iVar14)) goto LAB_003360e8;
  uVar13 = p->nWordsIn;
  uVar17 = vGroup->pArray[lVar20] * uVar13;
  if ((int)uVar17 < 0) goto LAB_00336107;
  iVar4 = p->vWordsIn->nSize;
  if ((int)uVar17 < iVar4) {
    uVar22 = piVar15[lVar26 + 1];
    if (((int)uVar22 < 0) || (vGroup->nSize <= (int)uVar22)) goto LAB_003360e8;
    uVar21 = vGroup->pArray[uVar22] * uVar13;
    if ((-1 < (int)uVar21) && ((int)uVar21 < iVar4)) {
      if (0 < (int)uVar13) {
        pwVar7 = p->vWordsIn->pArray;
        uVar19 = 0;
        bVar27 = false;
        do {
          uVar23 = pwVar7[uVar21 + uVar19];
          bVar10 = false;
          if (pwVar7[uVar17 + uVar19] != uVar23) {
            uVar23 = uVar23 ^ pwVar7[uVar17 + uVar19];
            bVar10 = true;
            if (((((uVar23 >> 1 ^ uVar23) & 0x5555555555555555) == 0) &&
                (uVar23 = uVar23 & 0x5555555555555555 & uVar23 >> 1, uVar23 != 0)) &&
               (bVar12 = !bVar27, bVar27 = true, bVar12)) {
              uVar23 = (uVar23 >> 2 & 0x3333333333333333) + (uVar23 & 0x3333333333333333);
              bVar27 = ((uVar23 >> 4) + uVar23 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38 < 2;
              bVar10 = !bVar27;
            }
          }
          if (bVar10) {
            bVar27 = false;
            break;
          }
          uVar19 = uVar19 + 1;
        } while (uVar13 != uVar19);
        if (bVar27) {
          if ((int)uVar13 < 1) {
LAB_003360c9:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadPlaMo.c"
                          ,0x15a,"int Mop_ManFindDiffVar(word *, word *, int)");
          }
          uVar19 = 0;
          do {
            uVar25 = 0;
            bVar27 = false;
            if (((pwVar7[uVar21 + uVar19] ^ pwVar7[uVar17 + uVar19]) & 3) == 0) {
              bVar16 = 2;
              uVar25 = 0;
              do {
                uVar24 = uVar25;
                bVar27 = 0x1e < uVar24;
                if (uVar24 == 0x1f) goto LAB_00335dbd;
                bVar11 = bVar16 & 0x3f;
                bVar16 = bVar16 + 2;
                uVar25 = uVar24 + 1;
              } while (((pwVar7[uVar21 + uVar19] ^ pwVar7[uVar17 + uVar19]) >> bVar11 & 3) == 0);
              bVar27 = 0x1e < uVar24;
            }
            uVar23 = (ulong)(uint)((int)uVar19 * 0x20 + (int)uVar25);
LAB_00335dbd:
            if (!bVar27) goto LAB_00335dd3;
            uVar19 = uVar19 + 1;
            if (uVar19 == uVar13) goto LAB_003360c9;
          } while( true );
        }
      }
      __assert_fail("Mop_ManCheckDist1(pCube1, pCube2, p->nWordsIn)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadPlaMo.c"
                    ,0x1ef,
                    "int Mop_ManMergeDist1Pairs(Mop_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
  }
LAB_00336107:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
LAB_00335dd3:
  if (((int)uVar23 < 0) || (vStats->nSize <= (int)uVar23)) goto LAB_003360e8;
  if (nLimit < vStats->pArray[uVar23 & 0xffffffff]) {
LAB_00335f4a:
    lVar26 = lVar26 + 2;
    if (iVar3 <= (int)((uint)lVar26 | 1)) goto LAB_00335f67;
    goto LAB_00335c10;
  }
  Vec_IntPush(p_00,iVar14);
  Vec_IntPush(p_00,uVar22);
  pVVar8 = p->vFree;
  if (pVVar8->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
  }
  uVar13 = pVVar8->nSize - 1;
  pVVar8->nSize = uVar13;
  iVar4 = pVVar8->pArray[uVar13];
  uVar13 = p->nWordsIn;
  uVar18 = uVar13 * iVar4;
  if ((-1 < (int)uVar18) && ((int)uVar18 < p->vWordsIn->nSize)) {
    if (0 < (int)uVar13) {
      pwVar9 = p->vWordsIn->pArray;
      uVar19 = 0;
      do {
        pwVar9[uVar18 + uVar19] = pwVar7[uVar21 + uVar19] & pwVar7[uVar17 + uVar19];
        uVar19 = uVar19 + 1;
      } while (uVar13 != uVar19);
    }
    iVar5 = p->nWordsOut;
    uVar13 = iVar5 * iVar4;
    if (-1 < (int)uVar13) {
      iVar6 = p->vWordsOut->nSize;
      if ((int)uVar13 < iVar6) {
        if (vGroup->nSize <= iVar14) goto LAB_003360e8;
        uVar17 = vGroup->pArray[lVar20] * iVar5;
        if ((-1 < (int)uVar17) && ((int)uVar17 < iVar6)) {
          if (vGroup->nSize <= (int)uVar22) goto LAB_003360e8;
          uVar22 = vGroup->pArray[uVar22] * iVar5;
          if ((-1 < (int)uVar22) && ((int)uVar22 < iVar6)) {
            pwVar7 = p->vWordsOut->pArray;
            iVar14 = bcmp(pwVar7 + uVar17,pwVar7 + uVar22,(long)iVar5 * 8);
            if (iVar14 != 0) {
              __assert_fail("!memcmp(pCube1, pCube2, sizeof(word)*p->nWordsOut)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadPlaMo.c"
                            ,0x201,
                            "int Mop_ManMergeDist1Pairs(Mop_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                           );
            }
            if (0 < iVar5) {
              lVar20 = 0;
              do {
                pwVar7[(ulong)uVar13 + lVar20] = (pwVar7 + uVar17)[lVar20];
                lVar20 = lVar20 + 1;
              } while (iVar5 != lVar20);
            }
            Vec_IntPush(vGroupPrev,iVar4);
            goto LAB_00335f4a;
          }
        }
      }
    }
  }
  goto LAB_00336107;
}

Assistant:

int Mop_ManMergeDist1Pairs( Mop_Man_t * p, Vec_Int_t * vGroup, Vec_Int_t * vGroupPrev, Vec_Int_t * vStats, int nLimit )
{
    Vec_Int_t * vPairs    = Mop_ManFindDist1Pairs( p, vGroup );
    Vec_Int_t * vPairsNew = Mop_ManCompatiblePairs( vPairs, Vec_IntSize(vGroup) );
    int nCubes = Vec_IntSize(vGroup) + Vec_IntSize(vGroupPrev);
    int w, i, c1, c2, iCubeNew, iVar;
    // move cubes to the previous group
    word * pCube, * pCube1, * pCube2;
    Vec_Int_t * vToFree = Vec_IntAlloc( Vec_IntSize(vPairsNew) );
    Vec_IntForEachEntryDouble( vPairsNew, c1, c2, i )
    {
        pCube1 = Mop_ManCubeIn( p, Vec_IntEntry(vGroup, c1) );
        pCube2 = Mop_ManCubeIn( p, Vec_IntEntry(vGroup, c2) );
        assert( Mop_ManCheckDist1(pCube1, pCube2, p->nWordsIn) );

        // skip those cubes that have frequently appearing variables
        iVar = Mop_ManFindDiffVar( pCube1, pCube2, p->nWordsIn );
        if ( Vec_IntEntry( vStats, iVar ) > nLimit )
            continue;
        Vec_IntPush( vToFree, c1 );
        Vec_IntPush( vToFree, c2 );

        iCubeNew  = Vec_IntPop( p->vFree );
        pCube  = Mop_ManCubeIn( p, iCubeNew );
        for ( w = 0; w < p->nWordsIn; w++ )
            pCube[w] = pCube1[w] & pCube2[w];

        pCube  = Mop_ManCubeOut( p, iCubeNew );
        pCube1 = Mop_ManCubeOut( p, Vec_IntEntry(vGroup, c1) );
        pCube2 = Mop_ManCubeOut( p, Vec_IntEntry(vGroup, c2) );

        assert( !memcmp(pCube1, pCube2, sizeof(word)*p->nWordsOut) );
        for ( w = 0; w < p->nWordsOut; w++ )
            pCube[w] = pCube1[w];

        Vec_IntPush( vGroupPrev, iCubeNew );
    }
//    Vec_IntForEachEntry( vPairsNew, c1, i )
    Vec_IntForEachEntry( vToFree, c1, i )
    {
        if ( Vec_IntEntry(vGroup, c1) == -1 )
            continue;
        Vec_IntPush( p->vFree, Vec_IntEntry(vGroup, c1) );
        Vec_IntWriteEntry( vGroup, c1, -1 );
    }
    Vec_IntFree( vToFree );
    if ( Vec_IntSize(vPairsNew) > 0 )
        Map_ManGroupCompact( vGroup );
    Vec_IntFree( vPairs );
    Vec_IntFree( vPairsNew );
    return nCubes - Vec_IntSize(vGroup) - Vec_IntSize(vGroupPrev);
}